

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::Array<unsigned_char>_> __thiscall
kj::AsyncInputStream::readAllBytes(AsyncInputStream *this,uint64_t limit)

{
  AllReader *limit_00;
  undefined1 local_38 [8];
  Promise<kj::Array<unsigned_char>_> promise;
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> reader;
  uint64_t limit_local;
  AsyncInputStream *this_local;
  
  heap<kj::(anonymous_namespace)::AllReader,kj::AsyncInputStream&>
            ((kj *)&promise,(AsyncInputStream *)limit);
  limit_00 = Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t>::operator->
                       ((Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)&promise);
  anon_unknown_123::AllReader::readAllBytes((AllReader *)local_38,(uint64_t)limit_00);
  mv<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)&promise);
  Promise<kj::Array<unsigned_char>>::
  attach<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((Promise<kj::Array<unsigned_char>> *)this,
             (Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)local_38);
  Promise<kj::Array<unsigned_char>_>::~Promise((Promise<kj::Array<unsigned_char>_> *)local_38);
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Array<byte>> AsyncInputStream::readAllBytes(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllBytes(limit);
  return promise.attach(kj::mv(reader));
}